

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 fts5IndexDataVersion(Fts5Index *p)

{
  sqlite3_stmt **ppStmt;
  int iVar1;
  sqlite3_int64 sVar2;
  char *zSql;
  sqlite3_stmt *pStmt;
  
  if (p->rc == 0) {
    ppStmt = &p->pDataVersion;
    pStmt = p->pDataVersion;
    if (pStmt == (sqlite3_stmt *)0x0) {
      zSql = sqlite3_mprintf("PRAGMA %Q.data_version",p->pConfig->zDb);
      iVar1 = fts5IndexPrepareStmt(p,ppStmt,zSql);
      p->rc = iVar1;
      if (iVar1 != 0) {
        return 0;
      }
      pStmt = *ppStmt;
    }
    iVar1 = sqlite3_step(pStmt);
    if (iVar1 == 100) {
      sVar2 = sqlite3_column_int64(*ppStmt,0);
    }
    else {
      sVar2 = 0;
    }
    iVar1 = sqlite3_reset(p->pDataVersion);
    p->rc = iVar1;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static i64 fts5IndexDataVersion(Fts5Index *p){
  i64 iVersion = 0;

  if( p->rc==SQLITE_OK ){
    if( p->pDataVersion==0 ){
      p->rc = fts5IndexPrepareStmt(p, &p->pDataVersion,
          sqlite3_mprintf("PRAGMA %Q.data_version", p->pConfig->zDb)
          );
      if( p->rc ) return 0;
    }

    if( SQLITE_ROW==sqlite3_step(p->pDataVersion) ){
      iVersion = sqlite3_column_int64(p->pDataVersion, 0);
    }
    p->rc = sqlite3_reset(p->pDataVersion);
  }

  return iVersion;
}